

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::TraceOfProduct::dim_forward
          (Dim *__return_storage_ptr__,TraceOfProduct *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer __s1;
  int iVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  
  __s1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)__s1 == 0x48) && (__s1->nd == __s1[1].nd))
     && (uVar1 = __s1->bd, uVar1 == __s1[1].bd)) {
    iVar2 = bcmp(__s1,__s1 + 1,(ulong)__s1->nd);
    if (iVar2 == 0) {
      __return_storage_ptr__->bd = uVar1;
      __return_storage_ptr__->nd = 1;
      __return_storage_ptr__->d[0] = 1;
      return __return_storage_ptr__;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad arguments in TraceOfProduct: ",0x21);
  poVar3 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to TraceOfProduct");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim TraceOfProduct::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 || xs[0] != xs[1]) {
    cerr << "Bad arguments in TraceOfProduct: " << xs << endl;
    throw std::invalid_argument("invalid arguments to TraceOfProduct");
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}